

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu384a.c
# Opt level: O1

MPP_RET hal_h265d_vdpu384a_start(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MPP_RET MVar2;
  long *plVar3;
  char *fmt;
  ulong uVar4;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  long local_50 [3];
  undefined8 local_38;
  
  if ((((task->dec).flags.val & 4) != 0) ||
     ((((task->dec).flags.val & 8) != 0 && (*(int *)(*(long *)((long)hal + 0x18) + 0x30) == 0)))) {
    if (((byte)hal_h265d_debug & 0x20) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"hal_h265d_vdpu384a","%s found task error\n",(char *)0x0,"hal_h265d_vdpu384a_start"
              );
    return MPP_OK;
  }
  plVar3 = (long *)((long)hal + (long)(task->dec).reg_index * 0x28 + 0x128);
  if (*(int *)((long)hal + 0x180) == 0) {
    plVar3 = (long *)((long)hal + 0x100);
  }
  lVar1 = *plVar3;
  if (lVar1 == 0) {
    _mpp_log_l(2,"hal_h265d_vdpu384a","hal_h265d_start hw_regs is NULL",(char *)0x0);
    return MPP_ERR_NULL_PTR;
  }
  uVar4 = 0;
  do {
    if (((byte)hal_h265d_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h265d_vdpu384a","RK_HEVC_DEC: regs[%02d]=%08X\n",(char *)0x0,
                 uVar4 & 0xffffffff,(ulong)*(uint *)(lVar1 + uVar4 * 4));
    }
    uVar4 = uVar4 + 1;
  } while ((int)uVar4 != 0x44);
  local_50[0] = lVar1 + 4;
  local_50[1] = 0x200000005c;
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,local_50);
  if (MVar2 == MPP_OK) {
    local_50[0] = lVar1 + 0x60;
    local_50[1] = 0x20000000088;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,local_50);
    if (MVar2 == MPP_OK) {
      local_50[0] = lVar1 + 0xe8;
      local_50[1] = 0x100000000ac;
      MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,local_50);
      if (MVar2 == MPP_OK) {
        local_50[0] = lVar1 + 0x194;
        local_50[1] = 0x2a000000104;
        MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,local_50);
        if (MVar2 == MPP_OK) {
          local_50[2] = lVar1 + 0x20;
          local_38 = 0x3c00000004;
          MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),5,local_50 + 2);
          if (MVar2 == MPP_OK) {
            vdpu384a_set_rcbinfo(*(MppDev *)((long)hal + 0x10),(Vdpu384aRcbInfo *)((long)hal + 100))
            ;
            MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0xf,(void *)0x0);
            if (MVar2 == MPP_OK) {
              return MPP_OK;
            }
            _mpp_log_l(2,"hal_h265d_vdpu384a","send cmd failed %d\n","hal_h265d_vdpu384a_start",
                       (ulong)(uint)MVar2);
            return MVar2;
          }
          goto LAB_001fbe87;
        }
      }
    }
    fmt = "set register write failed %d\n";
  }
  else {
LAB_001fbe87:
    fmt = "set register read failed %d\n";
  }
  _mpp_log_l(2,"hal_h265d_vdpu384a",fmt,"hal_h265d_vdpu384a_start",(ulong)(uint)MVar2);
  return MVar2;
}

Assistant:

static MPP_RET hal_h265d_vdpu384a_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_U8* p = NULL;
    Vdpu384aH265dRegSet *hw_regs = NULL;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;
    RK_S32 index =  task->dec.reg_index;

    RK_U32 i;

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        return MPP_OK;
    }

    if (reg_ctx->fast_mode) {
        p = (RK_U8*)reg_ctx->g_buf[index].hw_regs;
        hw_regs = ( Vdpu384aH265dRegSet *)reg_ctx->g_buf[index].hw_regs;
    } else {
        p = (RK_U8*)reg_ctx->hw_regs;
        hw_regs = ( Vdpu384aH265dRegSet *)reg_ctx->hw_regs;
    }

    if (hw_regs == NULL) {
        mpp_err("hal_h265d_start hw_regs is NULL");
        return MPP_ERR_NULL_PTR;
    }
    for (i = 0; i < 68; i++) {
        h265h_dbg(H265H_DBG_REG, "RK_HEVC_DEC: regs[%02d]=%08X\n",
                  i, *((RK_U32*)p));
        //mpp_log("RK_HEVC_DEC: regs[%02d]=%08X\n", i, *((RK_U32*)p));
        p += 4;
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &hw_regs->ctrl_regs;
        wr_cfg.size = sizeof(hw_regs->ctrl_regs);
        wr_cfg.offset = OFFSET_CTRL_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->common_addr;
        wr_cfg.size = sizeof(hw_regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->h265d_paras;
        wr_cfg.size = sizeof(hw_regs->h265d_paras);
        wr_cfg.offset = OFFSET_CODEC_PARAS_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->h265d_addrs;
        wr_cfg.size = sizeof(hw_regs->h265d_addrs);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &hw_regs->ctrl_regs.reg15;
        rd_cfg.size = sizeof(hw_regs->ctrl_regs.reg15);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* rcb info for sram */
        vdpu384a_set_rcbinfo(reg_ctx->dev, (Vdpu384aRcbInfo*)reg_ctx->rcb_info);

        ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    return ret;
}